

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::IRContext::GetBuiltinInputVarId(IRContext *this,uint32_t builtin)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t ty_id;
  bool bVar1;
  pointer ppVar2;
  TypeManager *this_00;
  Type *pTVar3;
  Instruction *this_01;
  DefUseManager *this_02;
  type inst;
  Module *this_03;
  DecorationManager *this_04;
  mapped_type *pmVar4;
  Operand *local_2f0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_2d8
  ;
  allocator<spvtools::opt::Operand> local_2cd;
  uint local_2cc;
  iterator local_2c8;
  undefined8 local_2c0;
  SmallVector<unsigned_int,_2UL> local_2b8;
  Operand local_290;
  iterator local_260;
  _func_int **local_258;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_250;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_238
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newVarOp;
  uint32_t varTyPtrId;
  uint32_t type_id;
  Vector v4uint_ty;
  Type *reg_uint_ty_1;
  Integer uint_ty_2;
  Vector v3float_ty;
  Type *reg_float_ty_1;
  Float float_ty_1;
  Vector v3uint_ty;
  Type *reg_uint_ty;
  Integer uint_ty_1;
  Integer uint_ty;
  Vector v4float_ty;
  Type *reg_float_ty;
  Float float_ty;
  Type *reg_type;
  TypeManager *type_mgr;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_30;
  uint32_t var_id;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  iterator it;
  uint32_t builtin_local;
  IRContext *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
       builtin;
  bVar1 = AreAnalysesValid(this,kAnalysisBuiltinVarId);
  if (!bVar1) {
    ResetBuiltinAnalysis(this);
  }
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(&this->builtin_var_id_map_,
              (key_type *)
              ((long)&it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 4));
  _Stack_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(&this->builtin_var_id_map_);
  bVar1 = std::__detail::operator!=(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *
                        )&local_28);
    return ppVar2->second;
  }
  type_mgr._4_4_ =
       FindBuiltinInputVar(this,it.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ._M_cur._4_4_);
  if (type_mgr._4_4_ != 0) goto LAB_003cfea3;
  this_00 = get_type_mgr(this);
  if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_
      - 7 < 2) {
LAB_003cfaa1:
    analysis::Integer::Integer((Integer *)&uint_ty_1.signed_,0x20,false);
    float_ty.super_Type._32_8_ =
         analysis::TypeManager::GetRegisteredType(this_00,(Type *)&uint_ty_1.signed_);
    analysis::Integer::~Integer((Integer *)&uint_ty_1.signed_);
  }
  else if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
           _4_4_ == 0xd) {
    analysis::Float::Float((Float *)&reg_float_ty_1,0x20);
    pTVar3 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)&reg_float_ty_1);
    analysis::Vector::Vector((Vector *)&uint_ty_2.signed_,pTVar3,3);
    float_ty.super_Type._32_8_ =
         analysis::TypeManager::GetRegisteredType(this_00,(Type *)&uint_ty_2.signed_);
    analysis::Vector::~Vector((Vector *)&uint_ty_2.signed_);
    analysis::Float::~Float((Float *)&reg_float_ty_1);
  }
  else if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
           _4_4_ == 0xf) {
    analysis::Float::Float((Float *)&reg_float_ty,0x20);
    pTVar3 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)&reg_float_ty);
    analysis::Vector::Vector((Vector *)&uint_ty.signed_,pTVar3,4);
    float_ty.super_Type._32_8_ =
         analysis::TypeManager::GetRegisteredType(this_00,(Type *)&uint_ty.signed_);
    analysis::Vector::~Vector((Vector *)&uint_ty.signed_);
    analysis::Float::~Float((Float *)&reg_float_ty);
  }
  else {
    if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
        _4_4_ != 0x1c) {
      if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
          _4_4_ - 0x29 < 3) goto LAB_003cfaa1;
      if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
          _4_4_ == 0x1144) {
        analysis::Integer::Integer((Integer *)&reg_uint_ty_1,0x20,false);
        v4uint_ty._48_8_ = analysis::TypeManager::GetRegisteredType(this_00,(Type *)&reg_uint_ty_1);
        analysis::Vector::Vector((Vector *)&varTyPtrId,(Type *)v4uint_ty._48_8_,4);
        float_ty.super_Type._32_8_ =
             analysis::TypeManager::GetRegisteredType(this_00,(Type *)&varTyPtrId);
        analysis::Vector::~Vector((Vector *)&varTyPtrId);
        analysis::Integer::~Integer((Integer *)&reg_uint_ty_1);
        goto LAB_003cfc4c;
      }
      if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
          _4_4_ != 0x14c7) {
        __assert_fail("false && \"unhandled builtin\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp"
                      ,0x388,"uint32_t spvtools::opt::IRContext::GetBuiltinInputVarId(uint32_t)");
      }
    }
    analysis::Integer::Integer((Integer *)&reg_uint_ty,0x20,false);
    pTVar3 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)&reg_uint_ty);
    analysis::Vector::Vector((Vector *)&float_ty_1.super_Type.kind_,pTVar3,3);
    float_ty.super_Type._32_8_ =
         analysis::TypeManager::GetRegisteredType(this_00,(Type *)&float_ty_1.super_Type.kind_);
    analysis::Vector::~Vector((Vector *)&float_ty_1.super_Type.kind_);
    analysis::Integer::~Integer((Integer *)&reg_uint_ty);
  }
LAB_003cfc4c:
  newVarOp._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       analysis::TypeManager::GetTypeInstruction(this_00,(Type *)float_ty.super_Type._32_8_);
  newVarOp._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
       analysis::TypeManager::FindPointerToType
                 (this_00,newVarOp._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl.
                          _4_4_,Input);
  type_mgr._4_4_ = TakeNextId(this);
  this_01 = (Instruction *)operator_new(0x70);
  ty_id = (uint32_t)
          newVarOp._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_2cc = 1;
  local_2c8 = &local_2cc;
  local_2c0 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_2c8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2b8,init_list);
  Operand::Operand(&local_290,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_2b8);
  local_260 = &local_290;
  local_258 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_2cd);
  __l._M_len = (size_type)local_258;
  __l._M_array = local_260;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_250,__l,&local_2cd);
  Instruction::Instruction(this_01,this,OpVariable,ty_id,type_mgr._4_4_,&local_250);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_238,this_01);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_250);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_2cd);
  local_2f0 = (Operand *)&local_260;
  do {
    local_2f0 = local_2f0 + -1;
    Operand::~Operand(local_2f0);
  } while (local_2f0 != &local_290);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2b8);
  this_02 = get_def_use_mgr(this);
  inst = std::
         unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
         operator*(&local_238);
  analysis::DefUseManager::AnalyzeInstDefUse(this_02,inst);
  this_03 = module(this);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_2d8,&local_238);
  Module::AddGlobalValue(this_03,&local_2d8);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_2d8);
  this_04 = get_decoration_mgr(this);
  analysis::DecorationManager::AddDecorationVal
            (this_04,type_mgr._4_4_,0xb,
             it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
             ._4_4_);
  AddVarToEntryPoints(this,type_mgr._4_4_);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_238);
LAB_003cfea3:
  pmVar4 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->builtin_var_id_map_,
                        (key_type *)
                        ((long)&it.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ._M_cur + 4));
  *pmVar4 = type_mgr._4_4_;
  return type_mgr._4_4_;
}

Assistant:

uint32_t IRContext::GetBuiltinInputVarId(uint32_t builtin) {
  if (!AreAnalysesValid(kAnalysisBuiltinVarId)) ResetBuiltinAnalysis();
  // If cached, return it.
  std::unordered_map<uint32_t, uint32_t>::iterator it =
      builtin_var_id_map_.find(builtin);
  if (it != builtin_var_id_map_.end()) return it->second;
  // Look for one in shader
  uint32_t var_id = FindBuiltinInputVar(builtin);
  if (var_id == 0) {
    // If not found, create it
    // TODO(greg-lunarg): Add support for all builtins
    analysis::TypeManager* type_mgr = get_type_mgr();
    analysis::Type* reg_type;
    switch (spv::BuiltIn(builtin)) {
      case spv::BuiltIn::FragCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v4float_ty(reg_float_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4float_ty);
        break;
      }
      case spv::BuiltIn::VertexIndex:
      case spv::BuiltIn::InstanceIndex:
      case spv::BuiltIn::PrimitiveId:
      case spv::BuiltIn::InvocationId:
      case spv::BuiltIn::SubgroupLocalInvocationId: {
        analysis::Integer uint_ty(32, false);
        reg_type = type_mgr->GetRegisteredType(&uint_ty);
        break;
      }
      case spv::BuiltIn::GlobalInvocationId:
      case spv::BuiltIn::LaunchIdNV: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v3uint_ty(reg_uint_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3uint_ty);
        break;
      }
      case spv::BuiltIn::TessCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v3float_ty(reg_float_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3float_ty);
        break;
      }
      case spv::BuiltIn::SubgroupLtMask: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v4uint_ty(reg_uint_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4uint_ty);
        break;
      }
      default: {
        assert(false && "unhandled builtin");
        return 0;
      }
    }
    uint32_t type_id = type_mgr->GetTypeInstruction(reg_type);
    uint32_t varTyPtrId =
        type_mgr->FindPointerToType(type_id, spv::StorageClass::Input);
    // TODO(1841): Handle id overflow.
    var_id = TakeNextId();
    std::unique_ptr<Instruction> newVarOp(
        new Instruction(this, spv::Op::OpVariable, varTyPtrId, var_id,
                        {{spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
                          {uint32_t(spv::StorageClass::Input)}}}));
    get_def_use_mgr()->AnalyzeInstDefUse(&*newVarOp);
    module()->AddGlobalValue(std::move(newVarOp));
    get_decoration_mgr()->AddDecorationVal(
        var_id, uint32_t(spv::Decoration::BuiltIn), builtin);
    AddVarToEntryPoints(var_id);
  }
  builtin_var_id_map_[builtin] = var_id;
  return var_id;
}